

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Tree::_claim_root(Tree *this)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  bool bVar4;
  size_t ichild;
  csubstr cVar5;
  char *pcStack_48;
  size_t local_40;
  char msg [23];
  
  ichild = _claim(this);
  if (ichild != 0) {
    builtin_strncpy(msg,"check failed: (r == 0)",0x17);
    if (((byte)s_error_flags & 1) != 0) {
      bVar4 = is_debugger_attached();
      if (bVar4) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar5 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    local_40 = cVar5.len;
    pcStack_48 = cVar5.str;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x6365) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x6365) << 0x40,8);
    LVar3.name.str = pcStack_48;
    LVar3.name.len = local_40;
    (*p_Var1)(msg,0x17,LVar3,(this->m_callbacks).m_user_data);
  }
  _set_hierarchy(this,ichild,0xffffffffffffffff,0xffffffffffffffff);
  return;
}

Assistant:

void Tree::_claim_root()
{
    size_t r = _claim();
    _RYML_CB_ASSERT(m_callbacks, r == 0);
    _set_hierarchy(r, NONE, NONE);
}